

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O0

void cpprofiler::MessageMarshalling::serialize(vector<char,_std::allocator<char>_> *data,string *s)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this;
  value_type_conflict1 *__x;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  undefined7 in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd7;
  
  std::__cxx11::string::size();
  serialize((vector<char,_std::allocator<char>_> *)
            CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
            (int32_t)((ulong)in_RDI >> 0x20));
  this._M_current = (char *)std::__cxx11::string::begin();
  __x = (value_type_conflict1 *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_RDI);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&stack0xffffffffffffffe0);
    in_stack_ffffffffffffffd7 = *pcVar2;
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)this._M_current,__x);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

static void serialize(std::vector<char>& data, const std::string& s) {
    serialize(data, static_cast<int32_t>(s.size()));
    for (char c : s) {
      data.push_back(c);
    }
  }